

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<float,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar8 = Xc_indptr[col_num];
  lVar4 = Xc_indptr[col_num + 1];
  bVar9 = true;
  if (lVar4 == lVar8) goto LAB_002b4412;
  uVar11 = Xc_ind[lVar8];
  if ((long)ix_arr[end] < (long)uVar11) goto LAB_002b4412;
  lVar1 = lVar4 + -1;
  uVar5 = Xc_ind[lVar1];
  if ((long)uVar5 < (long)ix_arr[st]) goto LAB_002b4412;
  puVar3 = ix_arr + end;
  puVar13 = ix_arr + st;
  uVar10 = (end - st) + 1;
  if (((long)ix_arr[st] < (long)uVar11 || (ulong)(lVar4 - lVar8) < uVar10) ||
      (long)uVar5 < (long)ix_arr[end]) {
    *xmin = 0.0;
    *xmax = 0.0;
    dVar21 = 0.0;
    dVar18 = 0.0;
  }
  else {
    dVar18 = -INFINITY;
    dVar21 = INFINITY;
  }
  puVar2 = puVar3 + 1;
  uVar12 = (long)puVar2 - (long)puVar13 >> 3;
  if (missing_action == Fail) {
    while (0 < (long)uVar12) {
      uVar14 = uVar12 >> 1;
      uVar17 = ~uVar14 + uVar12;
      uVar12 = uVar14;
      if (puVar13[uVar14] < uVar11) {
        puVar13 = puVar13 + uVar14 + 1;
        uVar12 = uVar17;
      }
    }
    if (puVar13 == puVar2) goto LAB_002b43a7;
    lVar7 = lVar1 * 8 + 8;
    uVar11 = 0;
    while (uVar12 = *puVar13, uVar12 <= uVar5) {
      puVar16 = (ulong *)(Xc_ind + lVar8);
      uVar14 = *puVar16;
      if (uVar14 == uVar12) {
        uVar11 = uVar11 + 1;
        dVar19 = (double)Xc[lVar8];
        dVar20 = dVar19;
        if (dVar21 <= dVar19) {
          dVar20 = dVar21;
        }
        *xmin = dVar20;
        if (dVar19 <= dVar18) {
          dVar19 = dVar18;
        }
        dVar18 = dVar19;
        *xmax = dVar18;
        dVar21 = dVar20;
        if ((puVar13 == puVar3) || (lVar8 == lVar1)) break;
        puVar13 = puVar13 + 1;
        uVar12 = (long)Xc_ind + (lVar7 - (long)puVar16) >> 3;
        if (0 < (long)uVar12) {
          do {
            uVar14 = uVar12 >> 1;
            uVar17 = ~uVar14 + uVar12;
            uVar12 = uVar14;
            if (puVar16[uVar14] < *puVar13) {
              puVar16 = puVar16 + uVar14 + 1;
              uVar12 = uVar17;
            }
          } while (0 < (long)uVar12);
        }
        lVar8 = (long)puVar16 - (long)Xc_ind >> 3;
      }
      else if ((long)uVar12 < (long)uVar14) {
        puVar13 = puVar13 + 1;
        uVar12 = (long)puVar2 - (long)puVar13 >> 3;
        while (0 < (long)uVar12) {
          uVar17 = uVar12 >> 1;
          uVar15 = ~uVar17 + uVar12;
          uVar12 = uVar17;
          if (puVar13[uVar17] < uVar14) {
            puVar13 = puVar13 + uVar17 + 1;
            uVar12 = uVar15;
          }
        }
      }
      else {
        puVar6 = puVar16 + 1;
        uVar14 = (long)Xc_ind + (lVar7 - (long)(puVar16 + 1)) >> 3;
        while (0 < (long)uVar14) {
          uVar17 = uVar14 >> 1;
          uVar15 = ~uVar17 + uVar14;
          uVar14 = uVar17;
          if (puVar6[uVar17] < uVar12) {
            puVar6 = puVar6 + uVar17 + 1;
            uVar14 = uVar15;
          }
        }
        lVar8 = (long)puVar6 - (long)Xc_ind >> 3;
      }
      if ((puVar13 == puVar2) || (lVar8 == lVar4)) break;
    }
  }
  else {
    while (0 < (long)uVar12) {
      uVar14 = uVar12 >> 1;
      uVar17 = ~uVar14 + uVar12;
      uVar12 = uVar14;
      if (puVar13[uVar14] < uVar11) {
        puVar13 = puVar13 + uVar14 + 1;
        uVar12 = uVar17;
      }
    }
    if (puVar13 == puVar2) {
LAB_002b43a7:
      uVar11 = 0;
    }
    else {
      lVar7 = lVar1 * 8 + 8;
      uVar11 = 0;
      while (uVar12 = *puVar13, uVar12 <= uVar5) {
        puVar16 = (ulong *)(Xc_ind + lVar8);
        uVar14 = *puVar16;
        if (uVar14 == uVar12) {
          uVar11 = uVar11 + 1;
          dVar19 = (double)Xc[lVar8];
          dVar20 = dVar19;
          if (dVar21 <= dVar19) {
            dVar20 = dVar21;
          }
          dVar21 = (double)(~-(ulong)NAN(dVar21) & (ulong)dVar20 |
                           -(ulong)NAN(dVar21) & (ulong)dVar19);
          *xmin = dVar21;
          dVar20 = dVar19;
          if (dVar19 <= dVar18) {
            dVar20 = dVar18;
          }
          dVar18 = (double)(~-(ulong)NAN(dVar18) & (ulong)dVar20 |
                           -(ulong)NAN(dVar18) & (ulong)dVar19);
          *xmax = dVar18;
          if ((puVar13 == puVar3) || (lVar8 == lVar1)) break;
          puVar13 = puVar13 + 1;
          uVar12 = (long)Xc_ind + (lVar7 - (long)puVar16) >> 3;
          if (0 < (long)uVar12) {
            do {
              uVar14 = uVar12 >> 1;
              uVar17 = ~uVar14 + uVar12;
              uVar12 = uVar14;
              if (puVar16[uVar14] < *puVar13) {
                puVar16 = puVar16 + uVar14 + 1;
                uVar12 = uVar17;
              }
            } while (0 < (long)uVar12);
          }
          lVar8 = (long)puVar16 - (long)Xc_ind >> 3;
        }
        else if ((long)uVar12 < (long)uVar14) {
          puVar13 = puVar13 + 1;
          uVar12 = (long)puVar2 - (long)puVar13 >> 3;
          while (0 < (long)uVar12) {
            uVar17 = uVar12 >> 1;
            uVar15 = ~uVar17 + uVar12;
            uVar12 = uVar17;
            if (puVar13[uVar17] < uVar14) {
              puVar13 = puVar13 + uVar17 + 1;
              uVar12 = uVar15;
            }
          }
        }
        else {
          puVar6 = puVar16 + 1;
          uVar14 = (long)Xc_ind + (lVar7 - (long)(puVar16 + 1)) >> 3;
          while (0 < (long)uVar14) {
            uVar17 = uVar14 >> 1;
            uVar15 = ~uVar17 + uVar14;
            uVar14 = uVar17;
            if (puVar6[uVar17] < uVar12) {
              puVar6 = puVar6 + uVar17 + 1;
              uVar14 = uVar15;
            }
          }
          lVar8 = (long)puVar6 - (long)Xc_ind >> 3;
        }
        if ((puVar13 == puVar2) || (lVar8 == lVar4)) break;
      }
    }
  }
  if (uVar11 < uVar10) {
    if (0.0 <= dVar21) {
      dVar21 = 0.0;
    }
    *xmin = dVar21;
    if (dVar18 <= 0.0) {
      dVar18 = 0.0;
    }
    *xmax = dVar18;
  }
  if (((dVar21 != dVar18) || (NAN(dVar21) || NAN(dVar18))) &&
     (dVar18 != -INFINITY || dVar21 != INFINITY)) {
    bVar9 = NAN(dVar18);
  }
LAB_002b4412:
  *unsplittable = bVar9;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}